

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::BasicReporter::~BasicReporter(BasicReporter *this)

{
  pointer pcVar1;
  IConfig *pIVar2;
  
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__BasicReporter_001613b0;
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  ~vector(&this->m_sectionSpans);
  pcVar1 = (this->m_testSpan).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_testSpan).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_groupSpan).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_groupSpan).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_testingSpan).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_testingSpan).name.field_2) {
    operator_delete(pcVar1);
  }
  pIVar2 = (this->m_config).m_fullConfig.m_p;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

BasicReporter::~BasicReporter() {}